

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void read_big_endian_2byte_word(unsigned_short *blockadr,FILE *f)

{
  FILE *in_RSI;
  undefined2 *in_RDI;
  unsigned_short block;
  uint8 bytes [2];
  undefined1 local_12;
  undefined1 local_11;
  FILE *local_10;
  undefined2 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fread(&local_12,1,1,in_RSI);
  fread(&local_11,1,1,local_10);
  *local_8 = CONCAT11(local_12,local_11);
  return;
}

Assistant:

void read_big_endian_2byte_word(unsigned short *blockadr, FILE *f)
{
	uint8 bytes[2];
	unsigned short block;

	fread(&bytes[0], 1, 1, f);
	fread(&bytes[1], 1, 1, f);

	block = 0;
	block |= bytes[0];
	block = block << 8;
	block |= bytes[1];

	blockadr[0] = block;
}